

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

void ckh_delete(tsd_t *tsd,ckh_t *ckh)

{
  ulong uVar1;
  rtree_leaf_elm_t *prVar2;
  ulong uVar3;
  ulong uVar4;
  arena_t *arena;
  long in_RSI;
  rtree_ctx_t *in_RDI;
  tsd_t *tsd_1;
  uint8_t state;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  uint8_t state_1;
  rtree_leaf_elm_t *elm_1;
  uintptr_t bits;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  szind_t szind;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  uint8_t state_2;
  rtree_leaf_elm_t *elm_2;
  rtree_leaf_elm_t *elm_3;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  uint maskbits_5;
  uint cumbits_5;
  uint ptrbits_5;
  uintptr_t mask_4;
  uint maskbits_6;
  uint cumbits_6;
  uint ptrbits_6;
  uintptr_t mask_5;
  uint maskbits_7;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_8;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_9;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  size_t ret;
  uintptr_t bits_1;
  void *result_1;
  uint8_t state_3;
  extent_t *extent;
  rtree_ctx_t *rtree_ctx_2;
  _Bool slab;
  szind_t szind_1;
  rtree_ctx_t *rtree_ctx_3;
  rtree_ctx_t rtree_ctx_fallback_2;
  rtree_leaf_elm_t *elm_6;
  uint8_t state_4;
  uint8_t state_5;
  rtree_leaf_elm_t *elm_7;
  uintptr_t bits_3;
  uintptr_t subkey_11;
  rtree_leaf_elm_t *leaf_11;
  uint i_3;
  uintptr_t subkey_10;
  rtree_leaf_elm_t *leaf_10;
  uintptr_t subkey_9;
  rtree_leaf_elm_t *leaf_9;
  uintptr_t leafkey_3;
  size_t slot_3;
  uint maskbits_15;
  uint cumbits_15;
  uint ptrbits_15;
  uintptr_t mask_12;
  uint maskbits_16;
  uint cumbits_16;
  uint ptrbits_16;
  uintptr_t mask_13;
  uint maskbits_17;
  uint shiftbits_9;
  uint cumbits_17;
  uint ptrbits_17;
  uintptr_t mask_14;
  uint maskbits_18;
  uint shiftbits_10;
  uint cumbits_18;
  uint ptrbits_18;
  uintptr_t mask_15;
  uint maskbits_19;
  uint shiftbits_11;
  uint cumbits_19;
  uint ptrbits_19;
  void *result_3;
  uintptr_t bits_2;
  rtree_leaf_elm_t *elm_4;
  rtree_leaf_elm_t *elm_5;
  uintptr_t subkey_8;
  rtree_leaf_elm_t *leaf_8;
  uint i_2;
  uintptr_t subkey_7;
  rtree_leaf_elm_t *leaf_7;
  uintptr_t subkey_6;
  rtree_leaf_elm_t *leaf_6;
  uintptr_t leafkey_2;
  size_t slot_2;
  uint maskbits_10;
  uint cumbits_10;
  uint ptrbits_10;
  uintptr_t mask_8;
  uint maskbits_11;
  uint cumbits_11;
  uint ptrbits_11;
  uintptr_t mask_9;
  uint maskbits_12;
  uint shiftbits_6;
  uint cumbits_12;
  uint ptrbits_12;
  uintptr_t mask_10;
  uint maskbits_13;
  uint shiftbits_7;
  uint cumbits_13;
  uint ptrbits_13;
  uintptr_t mask_11;
  uint maskbits_14;
  uint shiftbits_8;
  uint cumbits_14;
  uint ptrbits_14;
  void *result_2;
  _Bool ret_1;
  cache_bin_info_t *bin_info;
  cache_bin_t *bin;
  cache_bin_info_t *bin_info_1;
  cache_bin_t *bin_1;
  size_t ret_2;
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  undefined2 uVar5;
  rtree_ctx_t *key;
  rtree_ctx_t *rtree_ctx_00;
  undefined6 in_stack_ffffffffffffefb8;
  byte bVar6;
  byte bVar7;
  tsdn_t *tsdn;
  rtree_leaf_elm_t **local_1010;
  rtree_leaf_elm_t *in_stack_fffffffffffff0f8;
  tsdn_t *in_stack_fffffffffffff100;
  rtree_ctx_t *local_df0;
  uint local_d04;
  rtree_ctx_t local_b98;
  ulong local_a18;
  rtree_ctx_t *local_a10;
  rtree_ctx_t *local_a08;
  rtree_ctx_t *local_9f8;
  undefined1 local_9d1;
  rtree_leaf_elm_t *local_9b8;
  byte local_9a9;
  ulong local_9a8;
  rtree_ctx_t *local_9a0;
  rtree_t *local_998;
  rtree_ctx_t *local_990;
  uint local_984;
  rtree_leaf_elm_t *local_980;
  byte local_971;
  ulong local_970;
  rtree_ctx_t *local_968;
  rtree_t *local_960;
  rtree_ctx_t *local_958;
  rtree_leaf_elm_t *local_950;
  ulong local_948;
  rtree_leaf_elm_t *local_940;
  uint local_934;
  ulong local_930;
  rtree_leaf_elm_t *local_928;
  ulong local_920;
  rtree_leaf_elm_t *local_918;
  uintptr_t local_910;
  ulong local_908;
  undefined1 local_8fa;
  undefined1 local_8f9;
  ulong local_8f8;
  rtree_ctx_t *local_8f0;
  rtree_t *local_8e8;
  rtree_ctx_t *local_8e0;
  rtree_leaf_elm_t *local_8d8;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  ulong local_8c0;
  undefined8 local_8b8;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  ulong local_8a0;
  undefined8 local_898;
  uint local_88c;
  undefined4 local_888;
  uint local_884;
  undefined4 local_880;
  undefined4 local_87c;
  ulong local_878;
  undefined8 local_870;
  uint local_864;
  undefined4 local_860;
  uint local_85c;
  undefined4 local_858;
  undefined4 local_854;
  ulong local_850;
  undefined8 local_848;
  uint local_83c;
  undefined4 local_838;
  uint local_834;
  undefined4 local_830;
  undefined4 local_82c;
  ulong local_828;
  uint local_81c;
  size_t local_818;
  uint local_80c;
  void *local_808;
  byte local_7f9;
  rtree_leaf_elm_t *local_7f8;
  rtree_t *local_7f0;
  rtree_ctx_t *local_7e8;
  byte local_7d9;
  rtree_leaf_elm_t *local_7d8;
  rtree_t *local_7d0;
  rtree_ctx_t *local_7c8;
  void *local_7c0;
  uint local_7b4;
  rtree_leaf_elm_t *local_7b0;
  uint local_7a8;
  int local_7a4;
  void *local_7a0;
  undefined1 local_789;
  byte local_751;
  tsdn_t *local_750;
  undefined8 local_748;
  ulong local_740;
  
  uVar1 = *(ulong *)(in_RSI + 0x28);
  tsdn = (tsdn_t *)0x0;
  bVar7 = 1;
  bVar6 = 1;
  if (in_RDI == (rtree_ctx_t *)0x0) {
    local_1010 = (rtree_leaf_elm_t **)0x0;
  }
  else {
    local_1010 = &in_RDI[0x10].cache[3].leaf;
  }
  key = in_RDI;
  rtree_ctx_00 = in_RDI;
  witness_assert_depth_to_rank((witness_tsdn_t *)local_1010,0xc,0);
  uVar5 = (undefined2)((ulong)in_RSI >> 0x30);
  if ((bVar7 & 1) != 0) {
    local_df0 = (rtree_ctx_t *)&stack0xfffffffffffff070;
    if (in_RDI == (rtree_ctx_t *)0x0) {
      rtree_ctx_data_init(local_df0);
    }
    else {
      local_df0 = (rtree_ctx_t *)(in_RDI->cache + 3);
    }
    uVar3 = uVar1 >> 0x1e & 0xf;
    uVar4 = uVar1 & 0xffffffffc0000000;
    if (local_df0->cache[uVar3].leafkey != uVar4) {
      if (local_df0->l2_cache[0].leafkey == uVar4) {
        prVar2 = local_df0->l2_cache[0].leaf;
        local_df0->l2_cache[0].leafkey = local_df0->cache[uVar3].leafkey;
        local_df0->l2_cache[0].leaf = local_df0->cache[uVar3].leaf;
        local_df0->cache[uVar3].leafkey = uVar4;
        local_df0->cache[uVar3].leaf = prVar2;
      }
      else {
        for (local_d04 = 1; local_d04 < 8; local_d04 = local_d04 + 1) {
          if (local_df0->l2_cache[local_d04].leafkey == uVar4) {
            prVar2 = local_df0->l2_cache[local_d04].leaf;
            if (local_d04 == 0) {
              local_df0->l2_cache[0].leafkey = local_df0->cache[uVar3].leafkey;
              local_df0->l2_cache[0].leaf = local_df0->cache[uVar3].leaf;
            }
            else {
              local_df0->l2_cache[local_d04].leafkey = local_df0->l2_cache[local_d04 - 1].leafkey;
              local_df0->l2_cache[local_d04].leaf = local_df0->l2_cache[local_d04 - 1].leaf;
              local_df0->l2_cache[local_d04 - 1].leafkey = local_df0->cache[uVar3].leafkey;
              local_df0->l2_cache[local_d04 - 1].leaf = local_df0->cache[uVar3].leaf;
            }
            local_df0->cache[uVar3].leafkey = uVar4;
            local_df0->cache[uVar3].leaf = prVar2;
            goto LAB_0012d922;
          }
        }
        rtree_leaf_elm_lookup_hard
                  (tsdn,(rtree_t *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_ffffffffffffefb8)),
                   rtree_ctx_00,(uintptr_t)key,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
      }
    }
LAB_0012d922:
    switch(0x12da7d) {
    case 0:
      break;
    case 1:
    }
    arena = extent_arena_get((extent_t *)
                             CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
    local_a08 = &local_b98;
    local_a18 = uVar1;
    local_a10 = in_RDI;
    if (in_RDI == (rtree_ctx_t *)0x0) {
      rtree_ctx_data_init(local_a08);
      local_9f8 = local_a08;
    }
    else {
      local_9d1 = (undefined1)in_RDI->cache[0].leafkey;
      local_9f8 = (rtree_ctx_t *)(in_RDI->cache + 3);
    }
    local_990 = local_a10;
    local_998 = &extents_rtree;
    local_9a0 = local_9f8;
    local_9a8 = local_a18;
    local_9a9 = 1;
    local_958 = local_a10;
    local_960 = &extents_rtree;
    local_968 = local_9f8;
    local_970 = local_a18;
    local_971 = 1;
    local_8e0 = local_a10;
    local_8e8 = &extents_rtree;
    local_8f0 = local_9f8;
    local_8f8 = local_a18;
    local_8f9 = 1;
    local_8fa = 0;
    local_8c0 = local_a18;
    local_8c4 = 0x40;
    local_8c8 = 0x22;
    local_8cc = 0x1e;
    uVar3 = local_a18 >> 0x1e & 0xf;
    local_8a0 = local_a18;
    local_8a4 = 0x40;
    local_8a8 = 0x22;
    local_8ac = 0x1e;
    local_8b8 = 0xffffffffc0000000;
    uVar4 = local_a18 & 0xffffffffc0000000;
    local_910 = uVar4;
    local_908 = uVar3;
    if (local_9f8->cache[uVar3].leafkey == uVar4) {
      local_918 = local_9f8->cache[uVar3].leaf;
      local_878 = local_a18;
      local_87c = 1;
      local_880 = 0x40;
      local_884 = 0x34;
      local_888 = 0xc;
      local_88c = 0x12;
      local_898 = 0x3ffff;
      local_920 = local_a18 >> 0xc & 0x3ffff;
      local_8d8 = local_918 + local_920;
    }
    else if (local_9f8->l2_cache[0].leafkey == uVar4) {
      local_928 = local_9f8->l2_cache[0].leaf;
      local_9f8->l2_cache[0].leafkey = local_9f8->cache[uVar3].leafkey;
      local_8f0->l2_cache[0].leaf = local_8f0->cache[local_908].leaf;
      local_8f0->cache[local_908].leafkey = local_910;
      local_8f0->cache[local_908].leaf = local_928;
      local_850 = local_8f8;
      local_854 = 1;
      local_858 = 0x40;
      local_85c = 0x34;
      local_860 = 0xc;
      local_864 = 0x12;
      local_870 = 0x3ffff;
      local_930 = local_8f8 >> 0xc & 0x3ffff;
      local_8d8 = local_928 + local_930;
    }
    else {
      for (local_934 = 1; local_934 < 8; local_934 = local_934 + 1) {
        if (local_9f8->l2_cache[local_934].leafkey == uVar4) {
          local_940 = local_9f8->l2_cache[local_934].leaf;
          if (local_934 == 0) {
            local_9f8->l2_cache[0].leafkey = local_9f8->cache[uVar3].leafkey;
            local_8f0->l2_cache[0].leaf = local_8f0->cache[local_908].leaf;
          }
          else {
            local_9f8->l2_cache[local_934].leafkey = local_9f8->l2_cache[local_934 - 1].leafkey;
            local_9f8->l2_cache[local_934].leaf = local_9f8->l2_cache[local_934 - 1].leaf;
            local_9f8->l2_cache[local_934 - 1].leafkey = local_9f8->cache[uVar3].leafkey;
            local_9f8->l2_cache[local_934 - 1].leaf = local_9f8->cache[uVar3].leaf;
          }
          local_8f0->cache[local_908].leafkey = local_910;
          local_8f0->cache[local_908].leaf = local_940;
          local_828 = local_8f8;
          local_82c = 1;
          local_830 = 0x40;
          local_834 = 0x34;
          local_838 = 0xc;
          local_83c = 0x12;
          local_848 = 0x3ffff;
          local_948 = local_8f8 >> 0xc & 0x3ffff;
          local_8d8 = local_940 + local_948;
          goto LAB_0012e45c;
        }
      }
      local_8d8 = rtree_leaf_elm_lookup_hard
                            (tsdn,(rtree_t *)
                                  CONCAT17(bVar7,CONCAT16(bVar6,in_stack_ffffffffffffefb8)),
                             rtree_ctx_00,(uintptr_t)key,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0))
      ;
    }
LAB_0012e45c:
    local_980 = local_8d8;
    if (((local_971 & 1) == 0) && (local_8d8 == (rtree_leaf_elm_t *)0x0)) {
      local_950 = (rtree_leaf_elm_t *)0x0;
    }
    else {
      local_950 = local_8d8;
    }
    local_9b8 = local_950;
    if (((local_9a9 & 1) == 0) && (local_950 == (rtree_leaf_elm_t *)0x0)) {
      local_984 = 0xe8;
    }
    else {
      local_7e8 = local_990;
      local_7f0 = local_998;
      local_7f8 = local_950;
      local_7f9 = local_9a9 & 1;
      local_7c8 = local_990;
      local_7d0 = local_998;
      local_7d8 = local_950;
      local_7b4 = (byte)~local_7f9 & 1;
      local_7b0 = local_950;
      switch(local_7b4) {
      case 0:
        local_7a4 = 0;
        break;
      case 1:
        local_7a4 = 2;
      }
      if (local_7a4 - 1U < 2) {
        local_7c0 = (local_950->le_bits).repr;
      }
      else if (local_7a4 == 5) {
        local_7c0 = (local_950->le_bits).repr;
      }
      else {
        local_7c0 = (local_950->le_bits).repr;
      }
      local_808 = local_7c0;
      local_7a0 = local_7c0;
      local_984 = (uint)(ushort)((ulong)local_7c0 >> 0x30);
      local_7d9 = local_7f9;
      local_7a8 = local_7b4;
    }
    local_81c = local_984;
    local_80c = local_984;
    local_818 = sz_index2size_tab[local_984];
    arena_internal_sub(arena,local_818);
  }
  if (((bVar7 & 1) == 0) && (in_RDI != (rtree_ctx_t *)0x0)) {
    local_789 = (undefined1)in_RDI->cache[0].leafkey;
  }
  local_748 = 0;
  local_751 = bVar6 & 1;
  local_750 = tsdn;
  local_740 = uVar1;
  arena_dalloc_no_tcache(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  return;
}

Assistant:

void
ckh_delete(tsd_t *tsd, ckh_t *ckh) {
	assert(ckh != NULL);

#ifdef CKH_VERBOSE
	malloc_printf(
	    "%s(%p): ngrows: %"FMTu64", nshrinks: %"FMTu64","
	    " nshrinkfails: %"FMTu64", ninserts: %"FMTu64","
	    " nrelocs: %"FMTu64"\n", __func__, ckh,
	    (unsigned long long)ckh->ngrows,
	    (unsigned long long)ckh->nshrinks,
	    (unsigned long long)ckh->nshrinkfails,
	    (unsigned long long)ckh->ninserts,
	    (unsigned long long)ckh->nrelocs);
#endif

	idalloctm(tsd_tsdn(tsd), ckh->tab, NULL, NULL, true, true);
	if (config_debug) {
		memset(ckh, JEMALLOC_FREE_JUNK, sizeof(ckh_t));
	}
}